

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PECommander.cpp
# Opt level: O0

void __thiscall PECommander::initCommands(PECommander *this)

{
  SectionByAddrCommand *pSVar1;
  Command *pCVar2;
  SectionDumpCommand *pSVar3;
  allocator<char> local_339;
  string local_338;
  allocator<char> local_311;
  string local_310;
  undefined1 local_2ea;
  allocator<char> local_2e9;
  string local_2e8;
  allocator<char> local_2c1;
  string local_2c0;
  undefined1 local_29a;
  allocator<char> local_299;
  string local_298;
  allocator<char> local_271;
  string local_270;
  undefined1 local_24a;
  allocator<char> local_249;
  string local_248;
  allocator<char> local_221;
  string local_220;
  undefined1 local_1fa;
  allocator<char> local_1f9;
  string local_1f8;
  allocator<char> local_1d1;
  string local_1d0;
  undefined1 local_1aa;
  allocator<char> local_1a9;
  string local_1a8;
  allocator<char> local_181;
  string local_180;
  undefined1 local_15a;
  allocator<char> local_159;
  string local_158;
  allocator<char> local_131;
  string local_130;
  undefined1 local_10a;
  allocator<char> local_109;
  string local_108;
  allocator<char> local_e1;
  string local_e0;
  undefined1 local_ba;
  allocator<char> local_b9;
  string local_b8;
  allocator<char> local_91;
  string local_90;
  undefined1 local_6a;
  allocator<char> local_69;
  string local_68;
  allocator<char> local_31;
  string local_30;
  PECommander *local_10;
  PECommander *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"secV",&local_31);
  pSVar1 = (SectionByAddrCommand *)operator_new(0x30);
  local_6a = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"Section by RVA",&local_69)
  ;
  SectionByAddrCommand::SectionByAddrCommand(pSVar1,RVA,&local_68);
  local_6a = 0;
  Commander::addCommand((Commander *)this,&local_30,(Command *)pSVar1,true);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator(&local_69);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"secR",&local_91);
  pSVar1 = (SectionByAddrCommand *)operator_new(0x30);
  local_ba = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"Section by RAW",&local_b9)
  ;
  SectionByAddrCommand::SectionByAddrCommand(pSVar1,RAW,&local_b8);
  local_ba = 0;
  Commander::addCommand((Commander *)this,&local_90,(Command *)pSVar1,true);
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator(&local_b9);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator(&local_91);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e0,"rstrings",&local_e1);
  pCVar2 = (Command *)operator_new(0x28);
  local_10a = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_108,"Print Strings from resources",&local_109);
  PrintStringsCommand::PrintStringsCommand((PrintStringsCommand *)pCVar2,&local_108);
  local_10a = 0;
  Commander::addCommand((Commander *)this,&local_e0,pCVar2,true);
  std::__cxx11::string::~string((string *)&local_108);
  std::allocator<char>::~allocator(&local_109);
  std::__cxx11::string::~string((string *)&local_e0);
  std::allocator<char>::~allocator(&local_e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_130,"rsl",&local_131);
  pCVar2 = (Command *)operator_new(0x28);
  local_15a = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_158,"List Resource Types",&local_159);
  PrintWrapperTypesCommand::PrintWrapperTypesCommand((PrintWrapperTypesCommand *)pCVar2,&local_158);
  local_15a = 0;
  Commander::addCommand((Commander *)this,&local_130,pCVar2,true);
  std::__cxx11::string::~string((string *)&local_158);
  std::allocator<char>::~allocator(&local_159);
  std::__cxx11::string::~string((string *)&local_130);
  std::allocator<char>::~allocator(&local_131);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_180,"rs",&local_181);
  pCVar2 = (Command *)operator_new(0x28);
  local_1aa = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1a8,"Resource Info",&local_1a9);
  WrapperInfoCommand::WrapperInfoCommand((WrapperInfoCommand *)pCVar2,&local_1a8);
  local_1aa = 0;
  Commander::addCommand((Commander *)this,&local_180,pCVar2,true);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::allocator<char>::~allocator(&local_1a9);
  std::__cxx11::string::~string((string *)&local_180);
  std::allocator<char>::~allocator(&local_181);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d0,"dir_mv",&local_1d1);
  pCVar2 = (Command *)operator_new(0x28);
  local_1fa = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f8,"Move DataDirectory",&local_1f9);
  MoveDataDirEntryCommand::MoveDataDirEntryCommand((MoveDataDirEntryCommand *)pCVar2,&local_1f8);
  local_1fa = 0;
  Commander::addCommand((Commander *)this,&local_1d0,pCVar2,true);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::allocator<char>::~allocator(&local_1f9);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::allocator<char>::~allocator(&local_1d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_220,"secinfo",&local_221);
  pSVar3 = (SectionDumpCommand *)operator_new(0x30);
  local_24a = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_248,"Dump chosen Section info",&local_249);
  SectionDumpCommand::SectionDumpCommand(pSVar3,&local_248,false);
  local_24a = 0;
  Commander::addCommand((Commander *)this,&local_220,(Command *)pSVar3,true);
  std::__cxx11::string::~string((string *)&local_248);
  std::allocator<char>::~allocator(&local_249);
  std::__cxx11::string::~string((string *)&local_220);
  std::allocator<char>::~allocator(&local_221);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_270,"secfdump",&local_271);
  pSVar3 = (SectionDumpCommand *)operator_new(0x30);
  local_29a = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_298,"Dump chosen Section Content into a file",&local_299);
  SectionDumpCommand::SectionDumpCommand(pSVar3,&local_298,true);
  local_29a = 0;
  Commander::addCommand((Commander *)this,&local_270,(Command *)pSVar3,true);
  std::__cxx11::string::~string((string *)&local_298);
  std::allocator<char>::~allocator(&local_299);
  std::__cxx11::string::~string((string *)&local_270);
  std::allocator<char>::~allocator(&local_271);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2c0,"explist",&local_2c1);
  pCVar2 = (Command *)operator_new(0x28);
  local_2ea = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2e8,"List all exports",&local_2e9);
  ExportsListCommand::ExportsListCommand((ExportsListCommand *)pCVar2,&local_2e8);
  local_2ea = 0;
  Commander::addCommand((Commander *)this,&local_2c0,pCVar2,true);
  std::__cxx11::string::~string((string *)&local_2e8);
  std::allocator<char>::~allocator(&local_2e9);
  std::__cxx11::string::~string((string *)&local_2c0);
  std::allocator<char>::~allocator(&local_2c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_310,"implist",&local_311);
  pCVar2 = (Command *)operator_new(0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_338,"List all imports",&local_339);
  ImportsListCommand::ImportsListCommand((ImportsListCommand *)pCVar2,&local_338);
  Commander::addCommand((Commander *)this,&local_310,pCVar2,true);
  std::__cxx11::string::~string((string *)&local_338);
  std::allocator<char>::~allocator(&local_339);
  std::__cxx11::string::~string((string *)&local_310);
  std::allocator<char>::~allocator(&local_311);
  return;
}

Assistant:

void PECommander::initCommands()
{
    this->addCommand("secV", new SectionByAddrCommand(Executable::RVA, "Section by RVA"));
    this->addCommand("secR", new SectionByAddrCommand(Executable::RAW, "Section by RAW"));

    this->addCommand("rstrings", new PrintStringsCommand("Print Strings from resources"));
    this->addCommand("rsl", new PrintWrapperTypesCommand("List Resource Types"));
    this->addCommand("rs", new WrapperInfoCommand("Resource Info"));

    this->addCommand("dir_mv", new MoveDataDirEntryCommand("Move DataDirectory"));
    this->addCommand("secinfo", new SectionDumpCommand("Dump chosen Section info"));
    this->addCommand("secfdump", new SectionDumpCommand("Dump chosen Section Content into a file", true));
    
    this->addCommand("explist", new ExportsListCommand("List all exports"));
    this->addCommand("implist", new ImportsListCommand("List all imports"));
}